

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O0

void __thiscall
TransitionObservationIndependentMADPDiscrete::AddAction
          (TransitionObservationIndependentMADPDiscrete *this,Index agentI,string *name)

{
  size_type sVar1;
  undefined8 uVar2;
  reference ppMVar3;
  undefined8 in_RDX;
  uint in_ESI;
  long in_RDI;
  string *in_stack_ffffffffffffff78;
  EInvalidIndex *in_stack_ffffffffffffff80;
  value_type name_00;
  Index AI;
  MultiAgentDecisionProcessDiscrete *this_00;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  AI = (Index)((ulong)in_RDX >> 0x20);
  sVar1 = std::
          vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
          ::size((vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                  *)(in_RDI + 0xd8));
  if (sVar1 <= in_ESI) {
    uVar2 = __cxa_allocate_exception(0x28);
    EInvalidIndex::EInvalidIndex(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
    __cxa_throw(uVar2,&EInvalidIndex::typeinfo,EInvalidIndex::~EInvalidIndex);
  }
  ppMVar3 = std::
            vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
            ::operator[]((vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                          *)(in_RDI + 0xd8),(ulong)in_ESI);
  name_00 = *ppMVar3;
  this_00 = (MultiAgentDecisionProcessDiscrete *)&stack0xffffffffffffffb7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  MultiAgentDecisionProcessDiscrete::AddAction
            (this_00,AI,(string *)name_00,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  return;
}

Assistant:

void TransitionObservationIndependentMADPDiscrete::AddAction(Index agentI, const string &name)
{
    if(agentI >= _m_individualMADPDs.size())
        throw EInvalidIndex("TransitionObservationIndependentMADPDiscrete::AddAction - agentI out of bounds...");
    _m_individualMADPDs[agentI]->AddAction(0, name);    
}